

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

int ImStb::is_word_boundary_from_right(ImGuiInputTextState *obj,int idx)

{
  bool bVar1;
  uint uVar2;
  unsigned_short *puVar3;
  
  if (0 < idx) {
    puVar3 = ImVector<unsigned_short>::operator[](&obj->TextW,idx + -1);
    bVar1 = is_separator((uint)*puVar3);
    uVar2 = 0;
    if (bVar1) {
      puVar3 = ImVector<unsigned_short>::operator[](&obj->TextW,idx);
      bVar1 = is_separator((uint)*puVar3);
      uVar2 = (uint)!bVar1;
    }
    return uVar2;
  }
  return 1;
}

Assistant:

static int  is_word_boundary_from_right(STB_TEXTEDIT_STRING* obj, int idx)      { return idx > 0 ? (is_separator(obj->TextW[idx - 1]) && !is_separator(obj->TextW[idx]) ) : 1; }